

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsignal.h
# Opt level: O0

void __thiscall
lsignal::signal<void_(int)>::delete_deffered_internal(signal<void_(int)> *this,internal_data *data)

{
  _List_node_base *this_00;
  iterator local_50;
  const_iterator local_48;
  const_iterator local_40 [2];
  _List_node_base *local_30;
  _List_node_base *local_28;
  iterator local_20;
  _List_iterator<lsignal::signal<void_(int)>::joint> it_to_remove;
  internal_data *data_local;
  signal<void_(int)> *this_local;
  
  it_to_remove._M_node = (_List_node_base *)data;
  local_28 = (_List_node_base *)
             std::__cxx11::
             list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
             ::begin(&data->_callbacks);
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
             ::end((list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
                    *)(it_to_remove._M_node + 3));
  local_20._M_node =
       (_List_node_base *)
       std::
       remove_if<std::_List_iterator<lsignal::signal<void(int)>::joint>,lsignal::signal<void(int)>::delete_deffered_internal(lsignal::signal<void(int)>::internal_data*)const::_lambda(lsignal::signal<void(int)>::joint_const&)_1_>
                 (local_28,local_30);
  this_00 = it_to_remove._M_node + 3;
  std::_List_const_iterator<lsignal::signal<void_(int)>::joint>::_List_const_iterator
            (local_40,&local_20);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
       ::end(it_to_remove._M_node + 3);
  std::_List_const_iterator<lsignal::signal<void_(int)>::joint>::_List_const_iterator
            (&local_48,&local_50);
  std::__cxx11::
  list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>::
  erase((list<lsignal::signal<void_(int)>::joint,_std::allocator<lsignal::signal<void_(int)>::joint>_>
         *)this_00,local_40[0],local_48);
  return;
}

Assistant:

void signal<R(Args...)>::delete_deffered_internal(internal_data* data) const
	{
		auto it_to_remove = std::remove_if(data->_callbacks.begin(), data->_callbacks.end(),
			[](const joint& jnt) { return jnt.connection->deleted; }
			);

		data->_callbacks.erase(it_to_remove, data->_callbacks.end());
	}